

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int f_seek(lua_State *L)

{
  int iVar1;
  FILE *__stream;
  lua_Integer __off;
  long n;
  
  __stream = (FILE *)tofile(L);
  iVar1 = luaL_checkoption(L,2,"cur",f_seek::modenames);
  __off = luaL_optinteger(L,3,0);
  iVar1 = fseek(__stream,__off,f_seek::mode[iVar1]);
  if (iVar1 != 0) {
    iVar1 = luaL_fileresult(L,0,(char *)0x0);
    return iVar1;
  }
  n = ftell(__stream);
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int f_seek (lua_State *L) {
  static const int mode[] = {SEEK_SET, SEEK_CUR, SEEK_END};
  static const char *const modenames[] = {"set", "cur", "end", NULL};
  FILE *f = tofile(L);
  int op = luaL_checkoption(L, 2, "cur", modenames);
  lua_Integer p3 = luaL_optinteger(L, 3, 0);
  l_seeknum offset = (l_seeknum)p3;
  luaL_argcheck(L, (lua_Integer)offset == p3, 3,
                  "not an integer in proper range");
  op = l_fseek(f, offset, mode[op]);
  if (op)
    return luaL_fileresult(L, 0, NULL);  /* error */
  else {
    lua_pushinteger(L, (lua_Integer)l_ftell(f));
    return 1;
  }
}